

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
          (string *__return_storage_ptr__,UnitTestImpl *this,int skip_count)

{
  allocator local_1d;
  int local_1c;
  UnitTestImpl *pUStack_18;
  int skip_count_local;
  UnitTestImpl *this_local;
  
  local_1c = skip_count;
  pUStack_18 = this;
  this_local = (UnitTestImpl *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string UnitTestImpl::CurrentOsStackTraceExceptTop(int skip_count) {
  (void)skip_count;
  return "";
}